

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O2

string * __thiscall
r_comp::Metadata::getObjectName_abi_cxx11_
          (string *__return_storage_ptr__,Metadata *this,uint16_t index)

{
  undefined2 in_register_00000012;
  __node_base *p_Var1;
  
  p_Var1 = &(this->global_references)._M_h._M_before_begin;
  do {
    p_Var1 = p_Var1->_M_nxt;
    if (p_Var1 == (__node_base *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
  } while (p_Var1[5]._M_nxt != (_Hash_node_base *)(ulong)CONCAT22(in_register_00000012,index));
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(p_Var1 + 1));
  return __return_storage_ptr__;
}

Assistant:

std::string Metadata::getObjectName(const uint16_t index) const
{
    std::unordered_map<std::string, Reference>::const_iterator r;

    for (r = global_references.begin(); r != global_references.end(); ++r) {
        if (r->second.index == index) {
            return r->first;
        }
    }

    std::string s;
    return s;
}